

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

bool StoreFrameValue(InstructionVMEvalContext *ctx,VmConstant *pointer,int offset,VmConstant *value,
                    uint storeSize)

{
  FunctionData *pFVar1;
  SynIdentifier *pSVar2;
  bool bVar3;
  Storage *this;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  uint base;
  uint local_34;
  
  local_34 = 0;
  this = FindTarget(ctx,pointer,&local_34);
  uVar5 = local_34;
  if (this == (Storage *)0x0) {
    if (ctx->hasError == false) {
      __assert_fail("ctx.hasError",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0x260,
                    "bool StoreFrameValue(InstructionVMEvalContext &, VmConstant *, int, VmConstant *, unsigned int)"
                   );
    }
    bVar3 = false;
  }
  else {
    if (ctx->printExecution != false) {
      pcVar4 = "---";
      iVar6 = 0x3617ed;
      if ((this->functionOwner != (VmFunction *)0x0) &&
         (pFVar1 = this->functionOwner->function, pFVar1 != (FunctionData *)0x0)) {
        pSVar2 = pFVar1->name;
        pcVar4 = (pSVar2->name).begin;
        iVar6 = (int)(pSVar2->name).end;
      }
      printf("      StoreFrameValue %.*s [%s] @ %04x + %02x [%02x]\n",
             (ulong)(uint)(iVar6 - (int)pcVar4),pcVar4,this->tag,(ulong)local_34,
             (ulong)(ushort)pointer->iValue,storeSize);
    }
    uVar5 = uVar5 + offset + (uint)(ushort)pointer->iValue;
    bVar3 = InstructionVMEvalContext::Storage::Reserve
                      (this,ctx,uVar5,(value->super_VmValue).type.size);
    if (bVar3) {
      CopyConstantRaw(ctx,(this->data).data + uVar5,(this->data).count - uVar5,value,storeSize);
      bVar3 = true;
    }
    else {
      bVar3 = false;
      anon_unknown.dwarf_24d90a::Report(ctx,"ERROR: out of stack space");
    }
  }
  return bVar3;
}

Assistant:

bool StoreFrameValue(InstructionVMEvalContext &ctx, VmConstant *pointer, int offset, VmConstant *value, unsigned storeSize)
{
	unsigned base = 0;

	if(InstructionVMEvalContext::Storage *target = FindTarget(ctx, pointer, base))
	{
		if(ctx.printExecution)
		{
			InplaceStr functionName = target->functionOwner && target->functionOwner->function ? target->functionOwner->function->name->name : InplaceStr("---");

			printf("      StoreFrameValue %.*s [%s] @ %04x + %02x [%02x]\n", FMT_ISTR(functionName), target->tag, base, pointer->iValue & memoryOffsetMask, storeSize);
		}

		unsigned location = (pointer->iValue & memoryOffsetMask) + base;

		location += offset;

		if(!target->Reserve(ctx, location, value->type.size))
		{
			Report(ctx, "ERROR: out of stack space");
			return false;
		}

		CopyConstantRaw(ctx, target->data.data + location, target->data.size() - location, value, storeSize);

		return true;
	}

	assert(ctx.hasError);

	return false;
}